

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O3

int32_t get_algorithm<short>(short d)

{
  short *psVar1;
  short sVar2;
  uint uVar3;
  ushort uVar4;
  int32_t iVar5;
  short sVar6;
  int iVar7;
  short *in_RSI;
  undefined6 in_register_0000003a;
  long *plVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  
  plVar8 = (long *)CONCAT62(in_register_0000003a,d);
  if (d == 0) {
    get_algorithm<short>();
    if ((ulong)*(uint *)(plVar8 + 1) == 0) {
      return 0;
    }
    lVar9 = 0;
    uVar11 = 0;
    do {
      psVar1 = (short *)(*plVar8 + lVar9);
      lVar9 = lVar9 + 2;
      uVar11 = uVar11 + (int)*psVar1 / (int)*in_RSI;
    } while ((ulong)*(uint *)(plVar8 + 1) * 2 != lVar9);
    return uVar11 & 0xffff;
  }
  uVar4 = -d;
  if (0 < d) {
    uVar4 = d;
  }
  uVar11 = (uint)uVar4;
  if ((uVar11 - 1 & uVar11) != 0) {
    bVar10 = (byte)LZCOUNT(uVar4) ^ 0xf;
    uVar3 = (uint)(0x8000 << bVar10) / (uint)uVar4;
    sVar2 = (short)uVar3;
    iVar7 = uVar3 * uVar11;
    if ((uVar11 + iVar7 & 0xffff) >> bVar10 == 0) {
      iVar5 = 2 - (uint)((0xe - (byte)LZCOUNT(uVar4) & 0x40) == 0);
    }
    else {
      sVar6 = (short)iVar7;
      sVar2 = (ushort)(0 < sVar6 || uVar4 <= (ushort)(sVar6 * -2)) + sVar2 * 2;
      iVar5 = 2;
    }
    sVar6 = -2 - sVar2;
    if (d < 0) {
      sVar6 = sVar2;
    }
    if (sVar6 != -1) {
      return iVar5;
    }
  }
  return 0;
}

Assistant:

static LIBDIVIDE_INLINE struct libdivide_s16_t libdivide_internal_s16_gen(
    int16_t d, int branchfree) {
    if (d == 0) {
        LIBDIVIDE_ERROR("divider must be != 0");
    }

    struct libdivide_s16_t result;

    // If d is a power of 2, or negative a power of 2, we have to use a shift.
    // This is especially important because the magic algorithm fails for -1.
    // To check if d is a power of 2 or its inverse, it suffices to check
    // whether its absolute value has exactly one bit set. This works even for
    // INT_MIN, because abs(INT_MIN) == INT_MIN, and INT_MIN has one bit set
    // and is a power of 2.
    uint16_t ud = (uint16_t)d;
    uint16_t absD = (d < 0) ? -ud : ud;
    uint16_t floor_log_2_d = 15 - libdivide_count_leading_zeros16(absD);
    // check if exactly one bit is set,
    // don't care if absD is 0 since that's divide by zero
    if ((absD & (absD - 1)) == 0) {
        // Branchfree and normal paths are exactly the same
        result.magic = 0;
        result.more = (uint8_t)(floor_log_2_d | (d < 0 ? LIBDIVIDE_NEGATIVE_DIVISOR : 0));
    } else {
        LIBDIVIDE_ASSERT(floor_log_2_d >= 1);

        uint8_t more;
        // the dividend here is 2**(floor_log_2_d + 31), so the low 16 bit word
        // is 0 and the high word is floor_log_2_d - 1
        uint16_t rem, proposed_m;
        proposed_m = libdivide_32_div_16_to_16((uint16_t)1 << (floor_log_2_d - 1), 0, absD, &rem);
        const uint16_t e = absD - rem;

        // We are going to start with a power of floor_log_2_d - 1.
        // This works if works if e < 2**floor_log_2_d.
        if (!branchfree && e < ((uint16_t)1 << floor_log_2_d)) {
            // This power works
            more = (uint8_t)(floor_log_2_d - 1);
        } else {
            // We need to go one higher. This should not make proposed_m
            // overflow, but it will make it negative when interpreted as an
            // int16_t.
            proposed_m += proposed_m;
            const uint16_t twice_rem = rem + rem;
            if (twice_rem >= absD || twice_rem < rem) proposed_m += 1;
            more = (uint8_t)(floor_log_2_d | LIBDIVIDE_ADD_MARKER);
        }

        proposed_m += 1;
        int16_t magic = (int16_t)proposed_m;

        // Mark if we are negative. Note we only negate the magic number in the
        // branchfull case.
        if (d < 0) {
            more |= LIBDIVIDE_NEGATIVE_DIVISOR;
            if (!branchfree) {
                magic = -magic;
            }
        }

        result.more = more;
        result.magic = magic;
    }
    return result;
}